

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

int lest::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                timeval *__timeout)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 extraout_RDX;
  ulong uVar3;
  uint uVar4;
  undefined7 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  undefined4 in_register_0000003c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  text *arg;
  anon_class_1_0_00000001 local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  uint local_114;
  fd_set *local_110;
  text local_108;
  text local_e8;
  text local_c8;
  text local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  text local_50;
  
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(in_register_0000003c,__nfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__readfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    arg = &local_a8;
    std::__cxx11::string::string((string *)arg,__str);
    bVar2 = select::anon_class_1_0_00000001::operator()(&local_121,arg);
    uVar4 = (uint)CONCAT71(extraout_var,bVar2);
LAB_0010d7a0:
    uVar4 = uVar4 ^ 1;
    std::__cxx11::string::~string((string *)arg);
  }
  else {
    uVar3 = 0;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __readfds->fds_bits[1];
    local_120 = __str;
    local_110 = __readfds;
    do {
      do {
        __lhs = pbVar1 + -1;
        if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_110->fds_bits[0]) {
          if ((uVar3 & 1) != 0) {
            arg = &local_108;
            std::__cxx11::string::string((string *)arg,local_120);
            bVar2 = select::anon_class_1_0_00000001::operator()(&local_121,arg);
            uVar4 = (uint)CONCAT71(extraout_var_00,bVar2);
            goto LAB_0010d7a0;
          }
          goto LAB_0010d7db;
        }
        bVar2 = std::operator==(__lhs,"@");
        uVar5 = (undefined7)((ulong)__str >> 8);
        if ((bVar2) || (bVar2 = std::operator==(__lhs,"*"), bVar2)) {
          return (int)CONCAT71(uVar5,1);
        }
        std::__cxx11::string::string((string *)&local_50,__lhs);
        std::__cxx11::string::string((string *)&local_c8,local_120);
        __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT71(uVar5,1);
        bVar2 = search(&local_50,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar2) {
          return (int)__str;
        }
        bVar2 = *(__lhs->_M_dataplus)._M_p == '!';
        uVar3 = CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar2);
        pbVar1 = __lhs;
      } while (!bVar2);
      local_114 = (uint)uVar3;
      __str = &local_70;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (__str,__lhs,1,0xffffffffffffffff);
      std::__cxx11::string::string((string *)&local_e8,local_120);
      bVar2 = search(__str,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)__str);
      uVar3 = (ulong)local_114;
    } while (!bVar2);
LAB_0010d7db:
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

inline bool select( text name, texts include )
{
    auto none = []( texts args ) { return args.size() == 0; };

#if lest_FEATURE_REGEX_SEARCH
    auto hidden = []( text arg ){ return match( { "\\[\\..*", "\\[hide\\]" }, arg ); };
#else
    auto hidden = []( text arg ){ return match( { "[.", "[hide]" }, arg ); };
#endif

    if ( none( include ) )
    {
        return ! hidden( name );
    }

    bool any = false;
    for ( auto pos = include.rbegin(); pos != include.rend(); ++pos )
    {
        auto & part = *pos;

        if ( part == "@" || part == "*" )
            return true;

        if ( search( part, name ) )
            return true;

        if ( '!' == part[0] )
        {
            any = true;
            if ( search( part.substr(1), name ) )
                return false;
        }
        else
        {
            any = false;
        }
    }
    return any && ! hidden( name );
}